

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O3

string * deqp::gles31::Functional::anon_unknown_0::genFrgShaderSrc
                   (string *__return_storage_ptr__,deUint32 seed,
                   vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                   *inputs,string *varName,bool uniform,float value)

{
  DataType dataType;
  DataType DVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  string *psVar6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  pointer pVVar12;
  ulong uVar13;
  float fVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string exp;
  ostringstream oss;
  Random rnd;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  float local_264;
  long *local_260;
  long local_258;
  long local_250;
  long lStack_248;
  long *local_240;
  long local_238;
  long local_230;
  long lStack_228;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0;
  undefined7 uStack_1cf;
  string *local_1c0;
  undefined1 local_1b8 [16];
  undefined1 auStack_1a8 [8];
  undefined1 auStack_1a0 [88];
  ios_base local_148 [264];
  deRandom local_40;
  
  local_264 = value;
  local_1c0 = __return_storage_ptr__;
  deRandom_init(&local_40,seed);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  *(undefined8 *)(*(_func_int **)(local_1b8._0_8_ + -0x18) + (long)(local_1b8 + 8)) = 4;
  *(undefined8 *)(*(_func_int **)(local_1b8._0_8_ + -0x18) + (long)(local_1b8 + 0x10)) = 7;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"precision highp float;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"out vec4 fragColor;\n",0x14);
  printFloatDeclaration((ostringstream *)local_1b8,varName,uniform,local_264);
  pVVar12 = (inputs->
            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar12 !=
      (inputs->
      super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      poVar4 = glu::operator<<((ostream *)local_1b8,pVVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
      pVVar12 = pVVar12 + 1;
    } while (pVVar12 !=
             (inputs->
             super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"int imod (int n, int d)",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"return (n < 0 ? d - 1 - (-1 - n) % d : n % d);",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"vec4 hsv (vec3 hsv)",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"\tfloat h = hsv.x * 3.0;\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"\tfloat r = max(0.0, 1.0 - h) + max(0.0, h - 2.0);\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"\tfloat g = max(0.0, 1.0 - abs(h - 1.0));\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"\tfloat b = max(0.0, 1.0 - abs(h - 2.0));\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"\tvec3 hs = mix(vec3(1.0), vec3(r, g, b), hsv.y);\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"\treturn vec4(hsv.z * hs, 1.0);\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"fragColor = vec4(vec3(",0x16);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1b8,(varName->_M_dataplus)._M_p,varName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"), 1.0);",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if ((inputs->
      super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (inputs->
      super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"switch (imod(int(0.5 * (",0x18);
    fVar14 = deRandom_getFloat(&local_40);
    *(uint *)(*(_func_int **)(local_1b8._0_8_ + -0x18) + (long)(local_1b8 + 0x18)) =
         *(uint *)(*(_func_int **)(local_1b8._0_8_ + -0x18) + (long)(local_1b8 + 0x18)) | 0x14;
    *(undefined8 *)(*(_func_int **)(local_1b8._0_8_ + -0x18) + (long)(local_1b8 + 8)) = 4;
    *(undefined8 *)(*(_func_int **)(local_1b8._0_8_ + -0x18) + (long)(local_1b8 + 0x10)) = 7;
    std::ostream::_M_insert<double>((double)(fVar14 * 1.5 + 0.5));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8," * gl_FragCoord.x - ",0x14);
    fVar14 = deRandom_getFloat(&local_40);
    *(uint *)(*(_func_int **)(local_1b8._0_8_ + -0x18) + (long)(local_1b8 + 0x18)) =
         *(uint *)(*(_func_int **)(local_1b8._0_8_ + -0x18) + (long)(local_1b8 + 0x18)) | 0x14;
    *(undefined8 *)(*(_func_int **)(local_1b8._0_8_ + -0x18) + (long)(local_1b8 + 8)) = 4;
    *(undefined8 *)(*(_func_int **)(local_1b8._0_8_ + -0x18) + (long)(local_1b8 + 0x10)) = 7;
    std::ostream::_M_insert<double>((double)(fVar14 * 1.5 + 0.5));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8," * gl_FragCoord.y)), ",0x15);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"))",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((inputs->
        super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>).
        _M_impl.super__Vector_impl_data._M_finish !=
        (inputs->
        super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      lVar11 = 0x48;
      uVar13 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\t\t",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"case ",5);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t\t",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"fragColor *= ",0xd);
        pVVar12 = (inputs->
                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        dataType = *(DataType *)((long)pVVar12 + lVar11 + -0x20);
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        lVar9 = *(long *)((long)pVVar12 + lVar11 + -8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a8,lVar9,
                   *(long *)((long)&(pVVar12->layout).location + lVar11) + lVar9);
        DVar1 = glu::getDataTypeScalarType(dataType);
        if ((DVar1 | TYPE_FLOAT_VEC4) == TYPE_UINT) {
          DVar1 = glu::getDataTypeFloatScalars(dataType);
          local_1e0 = &local_1d0;
          local_1d8 = 0;
          local_1d0 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e0);
          local_260 = &local_250;
          plVar7 = plVar5 + 2;
          if ((long *)*plVar5 == plVar7) {
            local_250 = *plVar7;
            lStack_248 = plVar5[3];
          }
          else {
            local_250 = *plVar7;
            local_260 = (long *)*plVar5;
          }
          local_258 = plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          glu::getDataTypeName(DVar1);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_260);
          local_240 = &local_230;
          plVar7 = plVar5 + 2;
          if ((long *)*plVar5 == plVar7) {
            local_230 = *plVar7;
            lStack_228 = plVar5[3];
          }
          else {
            local_230 = *plVar7;
            local_240 = (long *)*plVar5;
          }
          local_238 = plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_240);
          local_220 = &local_210;
          plVar7 = plVar5 + 2;
          if ((long *)*plVar5 == plVar7) {
            local_210 = *plVar7;
            lStack_208 = plVar5[3];
          }
          else {
            local_210 = *plVar7;
            local_220 = (long *)*plVar5;
          }
          local_218 = plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_220,(ulong)local_2a8._M_dataplus._M_p);
          local_200 = &local_1f0;
          plVar7 = plVar5 + 2;
          if ((long *)*plVar5 == plVar7) {
            local_1f0 = *plVar7;
            lStack_1e8 = plVar5[3];
          }
          else {
            local_1f0 = *plVar7;
            local_200 = (long *)*plVar5;
          }
          local_1f8 = plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_200);
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_288.field_2._M_allocated_capacity = *psVar8;
            local_288.field_2._8_8_ = plVar5[3];
          }
          else {
            local_288.field_2._M_allocated_capacity = *psVar8;
            local_288._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_288._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
          plVar7 = plVar5 + 2;
          if ((long *)*plVar5 == plVar7) {
            local_2b8 = *plVar7;
            lStack_2b0 = plVar5[3];
            local_2c8 = &local_2b8;
          }
          else {
            local_2b8 = *plVar7;
            local_2c8 = (long *)*plVar5;
          }
          local_2c0 = plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_2c8);
          if (local_2c8 != &local_2b8) {
            operator_delete(local_2c8,local_2b8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if (local_200 != &local_1f0) {
            operator_delete(local_200,local_1f0 + 1);
          }
          if (local_220 != &local_210) {
            operator_delete(local_220,local_210 + 1);
          }
          if (local_240 != &local_230) {
            operator_delete(local_240,local_230 + 1);
          }
          if (local_260 != &local_250) {
            operator_delete(local_260,local_250 + 1);
          }
          if (local_1e0 != &local_1d0) {
            operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
          }
        }
        if (((TYPE_UINT_VEC4 < dataType) || ((0x7f803c01eU >> ((ulong)dataType & 0x3f) & 1) == 0))
           && (3 < dataType - TYPE_BOOL)) {
          if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
            iVar2 = glu::getDataTypeMatrixNumRows(dataType);
            iVar3 = glu::getDataTypeMatrixNumColumns(dataType);
            if (iVar2 == iVar3) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,"hsv(vec3(determinant(",0x15);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1b8,local_2a8._M_dataplus._M_p,
                                  local_2a8._M_string_length);
              lVar9 = 3;
              pcVar10 = ")))";
            }
            else {
              if (2 < iVar3 && iVar2 != 3) {
                std::operator+(&local_288,"transpose(",&local_2a8);
                plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
                plVar7 = plVar5 + 2;
                if ((long *)*plVar5 == plVar7) {
                  local_2b8 = *plVar7;
                  lStack_2b0 = plVar5[3];
                  local_2c8 = &local_2b8;
                }
                else {
                  local_2b8 = *plVar7;
                  local_2c8 = (long *)*plVar5;
                }
                local_2c0 = plVar5[1];
                *plVar5 = (long)plVar7;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_2c8);
                if (local_2c8 != &local_2b8) {
                  operator_delete(local_2c8,local_2b8 + 1);
                }
                iVar2 = iVar3;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_288._M_dataplus._M_p != &local_288.field_2) {
                  operator_delete(local_288._M_dataplus._M_p,
                                  local_288.field_2._M_allocated_capacity + 1);
                }
              }
              local_2c8 = &local_2b8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2c8,local_2a8._M_dataplus._M_p,
                         local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
              std::__cxx11::string::append((char *)&local_2c8);
              std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_2c8);
              if (local_2c8 != &local_2b8) {
                operator_delete(local_2c8,local_2b8 + 1);
              }
              if (3 < iVar2) {
                local_2c8 = &local_2b8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2c8,local_2a8._M_dataplus._M_p,
                           local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
                std::__cxx11::string::append((char *)&local_2c8);
                std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_2c8);
                if (local_2c8 != &local_2b8) {
                  operator_delete(local_2c8,local_2b8 + 1);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"hsv(",4);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1b8,local_2a8._M_dataplus._M_p,
                                  local_2a8._M_string_length);
              lVar9 = 1;
              pcVar10 = ")";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar10,lVar9);
          }
          goto switchD_0145ad25_default;
        }
        iVar2 = glu::getDataTypeScalarSize(dataType);
        switch(iVar2) {
        case 1:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"hsv(vec3(",9);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1b8,local_2a8._M_dataplus._M_p,
                              local_2a8._M_string_length);
          lVar9 = 0xc;
          pcVar10 = ", 1.0, 1.0))";
          break;
        case 2:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"hsv(vec3(",9);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1b8,local_2a8._M_dataplus._M_p,
                              local_2a8._M_string_length);
          lVar9 = 7;
          pcVar10 = ", 1.0))";
          break;
        case 3:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"vec4(",5);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1b8,local_2a8._M_dataplus._M_p,
                              local_2a8._M_string_length);
          lVar9 = 6;
          pcVar10 = ", 1.0)";
          break;
        case 4:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
        default:
          goto switchD_0145ad25_default;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar10,lVar9);
switchD_0145ad25_default:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,";",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\t\t\t",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"break;",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
        uVar13 = uVar13 + 1;
        lVar11 = lVar11 + 0x60;
      } while (uVar13 < (ulong)(((long)(inputs->
                                       super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(inputs->
                                       super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"case ",5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t\t",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"fragColor = vec4(1.0, 0.0, 1.0, 1.0);",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\t\t\t",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"break;",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"case -1:\n",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\t\t\t",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"fragColor = vec4(1.0, 1.0, 0.0, 1.0);",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\t\t\t",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"break;",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"default:",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\t\t\t",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"fragColor = vec4(1.0, 1.0, 0.0, 1.0);",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"}\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  psVar6 = (string *)std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x70));
  return psVar6;
}

Assistant:

string genFrgShaderSrc (deUint32							seed,
						const vector<VariableDeclaration>&	inputs,
						const string&						varName,
						bool								uniform,
						float								value = 0.0)
{
	Random				rnd		(seed);
	ostringstream		oss;

	oss.precision(4);
	oss.width(7);
	oss << "#version 310 es\n";

	oss << "precision highp float;\n";

	oss << "out vec4 fragColor;\n";

	printFloatDeclaration(oss, varName, uniform, value);

	for (vector<VariableDeclaration>::const_iterator it = inputs.begin();
		 it != inputs.end(); ++it)
		oss << *it << ";\n";

	// glsl % isn't defined for negative numbers
	oss << "int imod (int n, int d)" << "\n"
		<< "{" << "\n"
		<< "\t" << "return (n < 0 ? d - 1 - (-1 - n) % d : n % d);" << "\n"
		<< "}" << "\n";

	oss << "vec4 hsv (vec3 hsv)"
		<< "{" << "\n"
		<< "\tfloat h = hsv.x * 3.0;\n"
		<< "\tfloat r = max(0.0, 1.0 - h) + max(0.0, h - 2.0);\n"
		<< "\tfloat g = max(0.0, 1.0 - abs(h - 1.0));\n"
		<< "\tfloat b = max(0.0, 1.0 - abs(h - 2.0));\n"
		<< "\tvec3 hs = mix(vec3(1.0), vec3(r, g, b), hsv.y);\n"
		<< "\treturn vec4(hsv.z * hs, 1.0);\n"
		<< "}\n";

	oss << "void main (void)\n"
		<< "{\n";

	oss << "\t" << "fragColor = vec4(vec3(" << varName << "), 1.0);" << "\n";

	if (inputs.size() > 0)
	{
		oss << "\t"
			<< "switch (imod(int(0.5 * (";

		printFloat(oss, rnd.getFloat(0.5f, 2.0f));
		oss << " * gl_FragCoord.x - ";

		printFloat(oss, rnd.getFloat(0.5f, 2.0f));
		oss << " * gl_FragCoord.y)), "
			<< inputs.size() << "))" << "\n"
			<< "\t" << "{" << "\n";

		for (size_t i = 0; i < inputs.size(); ++i)
		{
			oss << "\t\t" << "case " << i << ":" << "\n"
				<< "\t\t\t" << "fragColor *= ";

			printInputColor(oss, inputs[i]);

			oss << ";" << "\n"
				<< "\t\t\t" << "break;" << "\n";
		}

		oss << "\t\t" << "case " << inputs.size() << ":\n"
			<< "\t\t\t" << "fragColor = vec4(1.0, 0.0, 1.0, 1.0);" << "\n";
		oss << "\t\t\t" << "break;" << "\n";

		oss << "\t\t" << "case -1:\n"
			<< "\t\t\t" << "fragColor = vec4(1.0, 1.0, 0.0, 1.0);" << "\n";
		oss << "\t\t\t" << "break;" << "\n";

		oss << "\t\t" << "default:" << "\n"
			<< "\t\t\t" << "fragColor = vec4(1.0, 1.0, 0.0, 1.0);" << "\n";

		oss << "\t" << "}\n";

	}

	oss << "}\n";

	return oss.str();
}